

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

void ASDCP::ATMOS::AtmosDescriptorDump(AtmosDescriptor *ADesc,FILE *stream)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  UUID local_d8;
  UL local_a8;
  char local_88 [8];
  char atmosID_buf [40];
  char local_58 [8];
  char str_buf [40];
  FILE *local_28;
  FILE *stream_local;
  AtmosDescriptor *ADesc_local;
  
  local_28 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    local_28 = _stderr;
  }
  uVar4 = (ADesc->super_DCDataDescriptor).EditRate.Numerator;
  uVar5 = (ADesc->super_DCDataDescriptor).EditRate.Denominator;
  uVar6 = (ADesc->super_DCDataDescriptor).ContainerDuration;
  UL::UL(&local_a8,(ADesc->super_DCDataDescriptor).DataEssenceCoding);
  pcVar7 = UL::EncodeString(&local_a8,local_58,0x28);
  bVar1 = ADesc->AtmosVersion;
  uVar2 = ADesc->MaxChannelCount;
  uVar3 = ADesc->MaxObjectCount;
  Kumu::UUID::UUID(&local_d8,ADesc->AtmosID);
  pcVar8 = Kumu::UUID::EncodeString(&local_d8,local_88,0x28);
  fprintf(local_28,
          "          EditRate: %d/%d\n   ContainerDuration: %u\n   DataEssenceCoding: %s\n        AtmosVersion: %u\n     MaxChannelCount: %u\n      MaxObjectCount: %u\n             AtmosID: %s\n           FirsFrame: %u\n"
          ,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,pcVar7,(uint)bVar1,(uint)uVar2,(uint)uVar3,pcVar8,
          ADesc->FirstFrame);
  Kumu::UUID::~UUID(&local_d8);
  UL::~UL(&local_a8);
  return;
}

Assistant:

void
ASDCP::ATMOS::AtmosDescriptorDump(const AtmosDescriptor& ADesc, FILE* stream)
{
  char str_buf[40];
  char atmosID_buf[40];
  if ( stream == 0 )
    stream = stderr;

  fprintf(stream, "\
          EditRate: %d/%d\n\
   ContainerDuration: %u\n\
   DataEssenceCoding: %s\n\
        AtmosVersion: %u\n\
     MaxChannelCount: %u\n\
      MaxObjectCount: %u\n\
             AtmosID: %s\n\
           FirsFrame: %u\n",
          ADesc.EditRate.Numerator, ADesc.EditRate.Denominator,
          ADesc.ContainerDuration,
          UL(ADesc.DataEssenceCoding).EncodeString(str_buf, 40),
          ADesc.AtmosVersion,
          ADesc.MaxChannelCount,
          ADesc.MaxObjectCount,
          UUID(ADesc.AtmosID).EncodeString(atmosID_buf, 40),
          ADesc.FirstFrame);
}